

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptSamplerState(HlslGrammar *this)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *syntax;
  size_type sVar6;
  TString stateName;
  HlslToken HStack_a8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  HlslToken local_58;
  
  bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  bVar4 = true;
  if (bVar3) {
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this->parseContext,&(this->super_HlslTokenStream).token,"unimplemented",
               "immediate sampler state","");
    do {
      local_58.field_2.string =
           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0;
      bVar3 = acceptIdentifier(this,&local_58);
      if (!bVar3) {
        bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
        return bVar3;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(&local_80,local_58.field_2.string);
      sVar2 = local_80._M_string_length;
      pcVar1 = local_80._M_dataplus._M_p;
      for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
        iVar5 = tolower((int)pcVar1[sVar6]);
        pcVar1[sVar6] = (char)iVar5;
      }
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
      if (!bVar3) {
        syntax = "assign";
        goto LAB_0033056a;
      }
      bVar3 = std::operator==(&local_80,"minlod");
      if (((bVar3) || (bVar3 = std::operator==(&local_80,"maxlod"), bVar3)) ||
         (bVar3 = std::operator==(&local_80,"maxanisotropy"), bVar3)) {
        bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
        if (!bVar3) {
          syntax = "integer";
          goto LAB_0033056a;
        }
        bVar3 = acceptLiteral(this,(TIntermTyped **)&HStack_a8);
        if (!bVar3) goto LAB_00330572;
      }
      else {
        bVar3 = std::operator==(&local_80,"filter");
        if (bVar3) {
          bVar3 = acceptIdentifier(this,&HStack_a8);
          if (!bVar3) {
            syntax = "filter mode";
            goto LAB_0033056a;
          }
        }
        else {
          bVar3 = std::operator==(&local_80,"addressu");
          if (((bVar3) || (bVar3 = std::operator==(&local_80,"addressv"), bVar3)) ||
             (bVar3 = std::operator==(&local_80,"addressw"), bVar3)) {
            bVar3 = acceptIdentifier(this,&HStack_a8);
            if (!bVar3) {
              syntax = "texture address mode";
              goto LAB_0033056a;
            }
          }
          else {
            bVar3 = std::operator==(&local_80,"miplodbias");
            if (!bVar3) {
              bVar3 = std::operator==(&local_80,"bordercolor");
              if (bVar3) goto LAB_00330572;
              syntax = "texture state";
              goto LAB_0033056a;
            }
            bVar3 = acceptLiteral(this,(TIntermTyped **)&HStack_a8);
            if (!bVar3) {
              syntax = "lod bias";
              goto LAB_0033056a;
            }
          }
        }
      }
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
    } while (bVar3);
    syntax = "semicolon";
LAB_0033056a:
    expected(this,syntax);
LAB_00330572:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool HlslGrammar::acceptSamplerState()
{
    // TODO: this should be genericized to accept a list of valid tokens and
    // return token/value pairs.  Presently it is specific to texture values.

    if (! acceptTokenClass(EHTokLeftBrace))
        return true;

    parseContext.warn(token.loc, "unimplemented", "immediate sampler state", "");

    do {
        // read state name
        HlslToken state;
        if (! acceptIdentifier(state))
            break;  // end of list

        // FXC accepts any case
        TString stateName = *state.string;
        std::transform(stateName.begin(), stateName.end(), stateName.begin(), ::tolower);

        if (! acceptTokenClass(EHTokAssign)) {
            expected("assign");
            return false;
        }

        if (stateName == "minlod" || stateName == "maxlod") {
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("integer");
                return false;
            }

            TIntermTyped* lod = nullptr;
            if (! acceptLiteral(lod))  // should never fail, since we just looked for an integer
                return false;
        } else if (stateName == "maxanisotropy") {
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("integer");
                return false;
            }

            TIntermTyped* maxAnisotropy = nullptr;
            if (! acceptLiteral(maxAnisotropy))  // should never fail, since we just looked for an integer
                return false;
        } else if (stateName == "filter") {
            HlslToken filterMode;
            if (! acceptIdentifier(filterMode)) {
                expected("filter mode");
                return false;
            }
        } else if (stateName == "addressu" || stateName == "addressv" || stateName == "addressw") {
            HlslToken addrMode;
            if (! acceptIdentifier(addrMode)) {
                expected("texture address mode");
                return false;
            }
        } else if (stateName == "miplodbias") {
            TIntermTyped* lodBias = nullptr;
            if (! acceptLiteral(lodBias)) {
                expected("lod bias");
                return false;
            }
        } else if (stateName == "bordercolor") {
            return false;
        } else {
            expected("texture state");
            return false;
        }

        // SEMICOLON
        if (! acceptTokenClass(EHTokSemicolon)) {
            expected("semicolon");
            return false;
        }
    } while (true);

    if (! acceptTokenClass(EHTokRightBrace))
        return false;

    return true;
}